

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_style_set_font(nk_context *ctx,nk_user_font *font)

{
  if (ctx != (nk_context *)0x0) {
    (ctx->style).font = font;
    (ctx->stacks).fonts.head = 0;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x3d5f,"void nk_style_set_font(struct nk_context *, const struct nk_user_font *)");
}

Assistant:

NK_API void
nk_style_set_font(struct nk_context *ctx, const struct nk_user_font *font)
{
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return;
    style = &ctx->style;
    style->font = font;
    ctx->stacks.fonts.head = 0;
}